

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QString>>
          (QtPrivate *this,QDebug debug,char *which,QList<QString> *c)

{
  long lVar1;
  QString *t;
  long lVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  QString *t_00;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  t = (c->d).ptr;
  lVar2 = (c->d).size;
  t_00 = t;
  if (lVar2 != 0) {
    QDebug::operator<<((QDebug *)debug.stream,t);
    t_00 = t + 1;
  }
  for (; t_00 != t + lVar2; t_00 = t_00 + 1) {
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    QDebug::operator<<(pQVar4,t_00);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}